

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O3

UtxoData * __thiscall
cfd::TransactionContext::GetTxInUtxoData
          (UtxoData *__return_storage_ptr__,TransactionContext *this,OutPoint *outpoint)

{
  UtxoData::UtxoData(__return_storage_ptr__);
  __return_storage_ptr__->address_type = kP2shAddress;
  __return_storage_ptr__->vout = 0;
  __return_storage_ptr__->block_height = 0;
  __return_storage_ptr__->binary_data = (void *)0x0;
  IsFindUtxoMap(this,outpoint,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

UtxoData TransactionContext::GetTxInUtxoData(const OutPoint& outpoint) const {
  UtxoData utxo;
  utxo.address_type = AddressType::kP2shAddress;
  utxo.vout = 0;
  utxo.block_height = 0;
  utxo.binary_data = nullptr;
  IsFindUtxoMap(outpoint, &utxo);
  return utxo;
}